

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O0

void __thiscall
covenant::CondEpsGen<covenant::Sym>::CondEpsGen
          (CondEpsGen<covenant::Sym> *this,cfg_digest_t *_digest,
          vector<int,_std::allocator<int>_> *_word,TermFactory *tfac)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  ulong uVar4;
  CondEpsGen<covenant::Sym> *in_RCX;
  long in_RSI;
  long *in_RDI;
  uint pi;
  uint ci_1;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> *sing;
  uint ci;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  shared_ptr<covenant::TerminalFactory> *in_stack_fffffffffffffe20;
  allocator_type *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  size_type in_stack_fffffffffffffe38;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  undefined1 *puVar5;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe70;
  CondEpsGen<covenant::Sym> *this_00;
  uint local_d8;
  uint local_d4;
  _Self local_d0;
  _Base_ptr local_c8;
  _Rb_tree_const_iterator<int> local_c0;
  set<int,_std::less<int>,_std::allocator<int>_> *local_b8;
  uint local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  *in_RDI = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
  *(int *)(in_RDI + 4) = (int)sVar2 + 1;
  *(undefined4 *)((long)in_RDI + 0x24) = *(undefined4 *)*in_RDI;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23aed3);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23aee8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
           (value_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           in_stack_fffffffffffffe28);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23af1c);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23af7f);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23af94);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
           (value_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           in_stack_fffffffffffffe28);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23afc8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_6a = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x23b01f);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (bool *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (allocator_type *)in_stack_fffffffffffffe28);
  std::allocator<bool>::~allocator((allocator<bool> *)0x23b053);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23b076);
  std::
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ::vector((vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
            *)0x23b08f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23b0a8);
  std::
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ::vector((vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
            *)0x23b0c1);
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23b113);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23b128);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
           (value_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           in_stack_fffffffffffffe28);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23b15c);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  lVar3 = (long)(int)in_RDI[4];
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  puVar5 = (undefined1 *)&stack0xffffffffffffff58;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x23b1b2);
  this_00 = (CondEpsGen<covenant::Sym> *)&stack0xffffffffffffff57;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23b1c4);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
           (value_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           in_stack_fffffffffffffe28);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x23b1ec);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
            (in_stack_fffffffffffffe20,
             (shared_ptr<covenant::TerminalFactory> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_b0 = 0;
  while( true ) {
    uVar4 = (ulong)local_b0;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
    if (sVar2 <= uVar4) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(ulong)local_b0);
    local_b8 = map_set<int,_int,_boost::hash<int>,_std::equal_to<int>_>::operator[]
                         ((map_set<int,_int,_boost::hash<int>,_std::equal_to<int>_> *)
                          in_stack_fffffffffffffe20,
                          (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_c0);
    local_c8 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_c0._M_node = local_c8;
    while( true ) {
      local_d0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      bVar1 = std::operator!=(&local_c0,&local_d0);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x23b317);
      addProd(this_00,(int)((ulong)puVar5 >> 0x20),(int)puVar5,(int)((ulong)lVar3 >> 0x20));
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe20);
    }
    local_b0 = local_b0 + 1;
  }
  local_d4 = 0;
  while( true ) {
    uVar4 = (ulong)local_d4;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
    if (sVar2 < uVar4) break;
    local_d8 = 0;
    while( true ) {
      uVar4 = (ulong)local_d8;
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(*in_RDI + 8));
      if (sVar2 <= uVar4) break;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(*in_RDI + 8),(ulong)local_d8);
      addProd(this_00,(int)((ulong)puVar5 >> 0x20),(int)puVar5,(int)((ulong)lVar3 >> 0x20));
      local_d8 = local_d8 + 1;
    }
    local_d4 = local_d4 + 1;
  }
  update_prods(in_RCX);
  return;
}

Assistant:

CondEpsGen(cfg_digest_t& _digest, const vector<int>& _word, TermFactory tfac)
        : digest(_digest), word(_word),
          nstates(1+word.size()), nprods(digest.nprods),
          produce_fwd(vector< vector<int> >(nstates*nprods, vector<int>())),
          produce_rev(vector< vector<int> >(nstates*nprods, vector<int>())),
          produced(vector<bool>(nstates*nstates*nprods, false)),
          //      produced((bool*) calloc(nstates*nstates*nprods, sizeof(bool))),
          head(0),
          eps_preds(nstates, vector<int>()),
          eps_succs(nstates, vector<int>()),
          _tfac(tfac)
    {
      // Assumption -- g is semi-normalized.
      // Single productions may be nullable, but
      // terminals may only occur in singleton productions; this means
      // we only need |P||Q|^2 space, rather than (|P|+|Sigma|)|Q|^2.
      
      // Initialize the leaf transitions.  
      for(unsigned int ci = 0; ci < word.size(); ci++)
      {
        set<int>& sing(digest.term_prods[word[ci]]);
        
        set<int>::iterator it;
        for(it = sing.begin(); it != sing.end(); ++it)
        {
          addProd(ci, *it, ci+1);
        }
      }
      
      // Add empty productions
      for(unsigned int ci = 0; ci <= word.size(); ci++)
      {
        for(unsigned int pi = 0; pi < digest.nullable_prods.size(); pi++)
        {
          addProd(ci, digest.nullable_prods[pi], ci);
        }
      }
      // Since we know we only recognize w, we can either
      // use the standard propagation approach, or use
      // a standard(-ish) CYK implementation.
      
      // For now, we'll use the worklist approach, since
      // it's already implemented.
      update_prods(); 
    }